

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * getobjname(Proto *p,int lastpc,int reg,char **name)

{
  int pc_00;
  uint reg_00;
  char *pcVar1;
  uint local_54;
  int b_1;
  int k_2;
  int k_1;
  int k;
  int b;
  OpCode op;
  Instruction i;
  int pc;
  char **name_local;
  int reg_local;
  int lastpc_local;
  Proto *p_local;
  
  pcVar1 = luaF_getlocalname(p,reg + 1,lastpc);
  *name = pcVar1;
  if (*name != (char *)0x0) {
    p_local = (Proto *)0x16dd2c;
    return (char *)p_local;
  }
  pc_00 = findsetreg(p,lastpc,reg);
  if (pc_00 == -1) goto LAB_00148413;
  local_54 = p->code[pc_00];
  switch(local_54 & 0x7f) {
  case 0:
    reg_00 = local_54 >> 0x10 & 0xff;
    if (reg_00 < (local_54 >> 7 & 0xff)) {
      pcVar1 = getobjname(p,pc_00,reg_00,name);
      return pcVar1;
    }
    goto LAB_00148413;
  default:
    goto LAB_00148413;
  case 3:
  case 4:
    if ((local_54 & 0x7f) == 3) {
      local_54 = local_54 >> 0xf;
    }
    else {
      local_54 = p->code[pc_00 + 1] >> 7;
    }
    if ((p->k[(int)local_54].tt_ & 0xf) == 4) {
      *name = (char *)(p->k[(int)local_54].value_.f + 0x18);
      p_local = (Proto *)anon_var_dwarf_3817c;
      return (char *)p_local;
    }
LAB_00148413:
    p_local = (Proto *)0x0;
    break;
  case 9:
    pcVar1 = upvalname(p,local_54 >> 0x10 & 0xff);
    *name = pcVar1;
    p_local = (Proto *)0x16dd41;
    break;
  case 0xb:
    kname(p,local_54 >> 0x18,name);
    p_local = (Proto *)gxf(p,pc_00,local_54,1);
    break;
  case 0xc:
    rname(p,pc_00,local_54 >> 0x18,name);
    p_local = (Proto *)gxf(p,pc_00,local_54,0);
    break;
  case 0xd:
    *name = "integer index";
    p_local = (Proto *)anon_var_dwarf_38171;
    break;
  case 0xe:
    kname(p,local_54 >> 0x18,name);
    p_local = (Proto *)gxf(p,pc_00,local_54,0);
    break;
  case 0x14:
    rkname(p,pc_00,local_54,name);
    p_local = (Proto *)0x16cc65;
  }
  return (char *)p_local;
}

Assistant:

static const char *getobjname (const Proto *p, int lastpc, int reg,
                               const char **name) {
  int pc;
  *name = luaF_getlocalname(p, reg + 1, lastpc);
  if (*name)  /* is a local? */
    return "local";
  /* else try symbolic execution */
  pc = findsetreg(p, lastpc, reg);
  if (pc != -1) {  /* could find instruction? */
    Instruction i = p->code[pc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_MOVE: {
        int b = GETARG_B(i);  /* move from 'b' to 'a' */
        if (b < GETARG_A(i))
          return getobjname(p, pc, b, name);  /* get name for 'b' */
        break;
      }
      case OP_GETTABUP: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return gxf(p, pc, i, 1);
      }
      case OP_GETTABLE: {
        int k = GETARG_C(i);  /* key index */
        rname(p, pc, k, name);
        return gxf(p, pc, i, 0);
      }
      case OP_GETI: {
        *name = "integer index";
        return "field";
      }
      case OP_GETFIELD: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return gxf(p, pc, i, 0);
      }
      case OP_GETUPVAL: {
        *name = upvalname(p, GETARG_B(i));
        return "upvalue";
      }
      case OP_LOADK:
      case OP_LOADKX: {
        int b = (op == OP_LOADK) ? GETARG_Bx(i)
                                 : GETARG_Ax(p->code[pc + 1]);
        if (ttisstring(&p->k[b])) {
          *name = svalue(&p->k[b]);
          return "constant";
        }
        break;
      }
      case OP_SELF: {
        rkname(p, pc, i, name);
        return "method";
      }
      default: break;  /* go through to return NULL */
    }
  }
  return NULL;  /* could not find reasonable name */
}